

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::upPartials
          (BeagleCPUImpl<double,_1,_0> *this,bool byPartition,int *operations,int count,
          int cumulativeScaleIndex)

{
  int iVar1;
  double **ppdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  int *piVar6;
  int *piVar7;
  double *pdVar8;
  double *pdVar9;
  bool bVar10;
  bool bVar11;
  _func_int **pp_Var12;
  uint uVar13;
  int *piVar14;
  int *piVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined4 in_register_00000084;
  long lVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  undefined8 uVar24;
  double *local_b0;
  double *local_a8;
  int scalingIndices [2];
  long local_58;
  int readScalingIndex;
  long local_48;
  int *local_40;
  long local_38;
  
  local_58 = CONCAT44(in_register_00000084,cumulativeScaleIndex);
  if (cumulativeScaleIndex == -1) {
    local_a8 = (double *)0x0;
  }
  else {
    local_a8 = this->gScaleBuffers[cumulativeScaleIndex];
  }
  local_40 = &this->kPatternCount;
  piVar15 = operations + 8;
  uVar22 = (ulong)(uint)(~(count >> 0x1f) & count);
  local_48 = (ulong)byPartition * 8 + 0x1c;
  do {
    bVar23 = uVar22 == 0;
    uVar22 = uVar22 - 1;
    if (bVar23) {
      return 0;
    }
    uVar18 = 0;
    local_38 = (long)piVar15[-8];
    iVar1 = piVar15[-7];
    readScalingIndex = piVar15[-6];
    uVar17 = 0;
    if (byPartition) {
      uVar17 = piVar15[-1];
      local_58 = (long)*piVar15;
      if (local_58 == -1) {
        local_a8 = (double *)0x0;
        local_58 = -1;
      }
      else {
        local_a8 = this->gScaleBuffers[local_58];
      }
    }
    piVar14 = local_40;
    if (byPartition) {
      piVar14 = this->gPatternPartitionsStartPatterns + (long)(int)uVar17 + 1;
      uVar18 = (ulong)(uint)piVar14[-1];
    }
    iVar21 = piVar15[-3];
    ppdVar2 = this->gPartials;
    iVar16 = piVar15[-5];
    pdVar3 = ppdVar2[iVar21];
    pdVar4 = ppdVar2[iVar16];
    pdVar5 = ppdVar2[local_38];
    piVar6 = this->gTipStates[iVar16];
    piVar7 = this->gTipStates[iVar21];
    pdVar8 = this->gTransitionMatrices[piVar15[-4]];
    pdVar9 = this->gTransitionMatrices[piVar15[-2]];
    uVar19 = (ulong)(uint)*piVar14;
    if (-1 < (char)this->kFlags) {
      uVar13 = (uint)this->kFlags;
      if ((uVar13 >> 8 & 1) != 0) {
        local_b0 = this->gScaleBuffers[local_38 - this->kTipCount];
LAB_0012dc89:
        bVar11 = true;
        bVar23 = false;
        bVar10 = false;
        goto LAB_0012dc90;
      }
      if ((uVar13 >> 0x19 & 1) == 0) {
        if (iVar1 < 0) {
          if (readScalingIndex < 0) goto LAB_0012df29;
          bVar11 = false;
          local_b0 = this->gScaleBuffers[(uint)readScalingIndex];
          bVar10 = true;
          bVar23 = false;
          goto LAB_0012dc90;
        }
        local_b0 = this->gScaleBuffers[iVar1];
        goto LAB_0012dc89;
      }
      if (piVar6 != (int *)0x0 || piVar7 != (int *)0x0) {
LAB_0012df29:
        bVar23 = false;
        goto LAB_0012dc6a;
      }
      (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x22])(this,&readScalingIndex,1,local_58);
      local_b0 = this->gScaleBuffers[iVar1];
      bVar11 = true;
LAB_0012df35:
      (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x43])
                (this,pdVar5,pdVar4,pdVar8,pdVar3,pdVar9,uVar18,uVar19);
      goto LAB_0012df69;
    }
    this->gActiveScalingFactors[local_38 - this->kTipCount] = 0;
    bVar23 = piVar6 == (int *)0x0 && piVar7 == (int *)0x0;
LAB_0012dc6a:
    bVar10 = false;
    bVar11 = false;
    local_b0 = (double *)0x0;
LAB_0012dc90:
    if (piVar6 == (int *)0x0) {
      if (piVar7 == (int *)0x0) {
        if (bVar23) {
          lVar20 = local_38 - this->kTipCount;
          (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x58])
                    (this,pdVar5,pdVar4,pdVar8,pdVar3,pdVar9,this->gActiveScalingFactors + lVar20);
          if (this->gActiveScalingFactors[lVar20] != 0) {
            (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x5b])
                      (this,pdVar5,this->gAutoScaleBuffers[lVar20]);
          }
        }
        else {
          if (!bVar10) goto LAB_0012df35;
          (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x57])
                    (this,pdVar5,pdVar4,pdVar8,pdVar3,pdVar9,local_b0,uVar18,uVar19);
        }
      }
      else {
        pp_Var12 = (this->super_BeagleImpl)._vptr_BeagleImpl;
        if (!bVar10) {
          (*pp_Var12[0x42])(this,pdVar5,piVar7,pdVar9,pdVar4,pdVar8,uVar18,uVar19);
          goto LAB_0012df69;
        }
        (*pp_Var12[0x55])(this,pdVar5,piVar7,pdVar9,pdVar4,pdVar8,local_b0,uVar18,uVar19);
      }
    }
    else {
      pp_Var12 = (this->super_BeagleImpl)._vptr_BeagleImpl;
      if (piVar7 == (int *)0x0) {
        if (!bVar10) {
          (*pp_Var12[0x42])(this,pdVar5,piVar6,pdVar8,pdVar3,pdVar9,uVar18,uVar19);
          goto LAB_0012df69;
        }
        (*pp_Var12[0x55])(this,pdVar5,piVar6,pdVar8,pdVar3,pdVar9,local_b0,uVar18,uVar19);
      }
      else if (bVar10) {
        (*pp_Var12[0x54])(this,pdVar5,piVar6,pdVar8,piVar7,pdVar9,local_b0,uVar18,uVar19);
      }
      else {
        (*pp_Var12[0x41])(this,pdVar5,piVar6,pdVar8,piVar7,pdVar9,uVar18,uVar19);
LAB_0012df69:
        if (bVar11) {
          pp_Var12 = (this->super_BeagleImpl)._vptr_BeagleImpl;
          if (byPartition) {
            (*pp_Var12[0x5a])(this,pdVar5,local_b0,local_a8,0,(ulong)uVar17);
          }
          else {
            (*pp_Var12[0x59])(this,pdVar5,local_b0,local_a8,0);
          }
        }
      }
    }
    if ((this->kFlags & 0x100) != 0) {
      iVar1 = this->kTipCount;
      iVar21 = iVar21 - iVar1;
      iVar16 = iVar16 - iVar1;
      if ((iVar16 < 0) || (iVar21 < 0)) {
        if ((iVar16 < 0) && (iVar16 = iVar21, iVar21 < 0)) goto LAB_0012e011;
        scalingIndices[0] = iVar16;
        pp_Var12 = (this->super_BeagleImpl)._vptr_BeagleImpl;
        uVar24 = 1;
      }
      else {
        pp_Var12 = (this->super_BeagleImpl)._vptr_BeagleImpl;
        uVar24 = 2;
        scalingIndices[0] = iVar16;
        scalingIndices[1] = iVar21;
      }
      (*pp_Var12[0x20])(this,scalingIndices,uVar24,(ulong)(uint)((int)local_38 - iVar1));
    }
LAB_0012e011:
    piVar15 = (int *)((long)piVar15 + local_48);
  } while( true );
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::upPartials(bool byPartition,
                                                  const int* operations,
                                                  int count,
                                                  int cumulativeScaleIndex) {

    REALTYPE* cumulativeScaleBuffer = NULL;
    if (cumulativeScaleIndex != BEAGLE_OP_NONE)
        cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];

    for (int op = 0; op < count; op++) {

        int numOps = BEAGLE_OP_COUNT;
        if (byPartition)
            numOps = BEAGLE_PARTITION_OP_COUNT;

        if (DEBUGGING_OUTPUT) {
            fprintf(stderr, "op[%d] = ", op);
            for (int j = 0; j < numOps; j++) {
                std::cerr << operations[op*numOps+j] << " ";
            }
            fprintf(stderr, "\n");
        }

        const int parIndex = operations[op * numOps];
        const int writeScalingIndex = operations[op * numOps + 1];
        const int readScalingIndex = operations[op * numOps + 2];
        const int child1Index = operations[op * numOps + 3];
        const int child1TransMatIndex = operations[op * numOps + 4];
        const int child2Index = operations[op * numOps + 5];
        const int child2TransMatIndex = operations[op * numOps + 6];
        int currentPartition = 0;
        if (byPartition) {
            currentPartition = operations[op * numOps + 7];
            cumulativeScaleIndex = operations[op * numOps + 8];
            if (cumulativeScaleIndex != BEAGLE_OP_NONE)
                cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];
            else
                cumulativeScaleBuffer = NULL;
        }

        const REALTYPE* partials1 = gPartials[child1Index];
        const REALTYPE* partials2 = gPartials[child2Index];

        const int* tipStates1 = gTipStates[child1Index];
        const int* tipStates2 = gTipStates[child2Index];

        const REALTYPE* matrices1 = gTransitionMatrices[child1TransMatIndex];
        const REALTYPE* matrices2 = gTransitionMatrices[child2TransMatIndex];

        REALTYPE* destPartials = gPartials[parIndex];

        int startPattern = 0;
        int endPattern = kPatternCount;
        if (byPartition) {
            startPattern = gPatternPartitionsStartPatterns[currentPartition];
            endPattern = gPatternPartitionsStartPatterns[currentPartition + 1];
        }

        int rescale = BEAGLE_OP_NONE;
        REALTYPE* scalingFactors = NULL;

        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            gActiveScalingFactors[parIndex - kTipCount] = 0;
            if (tipStates1 == 0 && tipStates2 == 0)
                rescale = 2;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            rescale = 1;
            scalingFactors = gScaleBuffers[parIndex - kTipCount];
        } else if (kFlags & BEAGLE_FLAG_SCALING_DYNAMIC) { // TODO: this is a quick and dirty implementation just so it returns correct results
            if (tipStates1 == 0 && tipStates2 == 0) {
                rescale = 1;
                removeScaleFactors(&readScalingIndex, 1, cumulativeScaleIndex);
                scalingFactors = gScaleBuffers[writeScalingIndex];
            }
        } else if (writeScalingIndex >= 0) {
            rescale = 1;
            scalingFactors = gScaleBuffers[writeScalingIndex];
        } else if (readScalingIndex >= 0) {
            rescale = 0;
            scalingFactors = gScaleBuffers[readScalingIndex];
        }

        if (DEBUGGING_OUTPUT) {
            std::cerr << "Rescale= " << rescale << " writeIndex= " << writeScalingIndex
                     << " readIndex = " << readScalingIndex << "\n";
        }

        if (tipStates1 != NULL) {
            if (tipStates2 != NULL ) {
                if (rescale == 0) { // Use fixed scaleFactors
                    calcStatesStatesFixedScaling(destPartials, tipStates1, matrices1, tipStates2,
                                                 matrices2, scalingFactors, startPattern, endPattern);
                } else {
                    // First compute without any scaling
                    calcStatesStates(destPartials, tipStates1, matrices1, tipStates2, matrices2,
                                     startPattern, endPattern);
                    if (rescale == 1) { // Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            } else {
                if (rescale == 0) {
                    calcStatesPartialsFixedScaling(destPartials, tipStates1, matrices1, partials2,
                                                   matrices2, scalingFactors, startPattern, endPattern);
                } else {
                    calcStatesPartials(destPartials, tipStates1, matrices1, partials2, matrices2,
                                       startPattern, endPattern);
                    if (rescale == 1) { // Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            }
        } else {
            if (tipStates2 != NULL) {
                if (rescale == 0) {
                    calcStatesPartialsFixedScaling(destPartials,tipStates2,matrices2,partials1,matrices1,
                                                   scalingFactors, startPattern, endPattern);
                } else {
                    calcStatesPartials(destPartials, tipStates2, matrices2, partials1, matrices1,
                                       startPattern, endPattern);
                    if (rescale == 1) {// Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            } else {
                if (rescale == 2) {
                    int sIndex = parIndex - kTipCount;
                    calcPartialsPartialsAutoScaling(destPartials,partials1,matrices1,partials2,matrices2,
                                                     &gActiveScalingFactors[sIndex]);
                    if (gActiveScalingFactors[sIndex])
                        autoRescalePartials(destPartials, gAutoScaleBuffers[sIndex]);

                } else if (rescale == 0) {
                    calcPartialsPartialsFixedScaling(destPartials,partials1,matrices1,partials2,
                                                     matrices2,scalingFactors,startPattern,endPattern);
                } else {
                    calcPartialsPartials(destPartials, partials1, matrices1, partials2, matrices2,
                                         startPattern, endPattern);
                    if (rescale == 1) {// Recompute scaleFactors
                        if (byPartition) {
                            rescalePartialsByPartition(destPartials,scalingFactors,cumulativeScaleBuffer,0, currentPartition);
                        } else {
                            rescalePartials(destPartials,scalingFactors,cumulativeScaleBuffer,0);
                        }
                    }
                }
            }
        }

        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            int parScalingIndex = parIndex - kTipCount;
            int child1ScalingIndex = child1Index - kTipCount;
            int child2ScalingIndex = child2Index - kTipCount;
            if (child1ScalingIndex >= 0 && child2ScalingIndex >= 0) {
                int scalingIndices[2] = {child1ScalingIndex, child2ScalingIndex};
                accumulateScaleFactors(scalingIndices, 2, parScalingIndex);
            } else if (child1ScalingIndex >= 0) {
                int scalingIndices[1] = {child1ScalingIndex};
                accumulateScaleFactors(scalingIndices, 1, parScalingIndex);
            } else if (child2ScalingIndex >= 0) {
                int scalingIndices[1] = {child2ScalingIndex};
                accumulateScaleFactors(scalingIndices, 1, parScalingIndex);
            }
        }

        if (DEBUGGING_OUTPUT) {
            if (scalingFactors != NULL && rescale == 0) {
                for(int i=0; i<kPatternCount; i++)
                    fprintf(stderr,"old scaleFactor[%d] = %.5f\n",i,scalingFactors[i]);
            }
            fprintf(stderr,"Result partials:\n");
            for(int i = 0; i < kPartialsSize; i++)
                fprintf(stderr,"destP[%d] = %.5f\n",i,destPartials[i]);
        }
    }

    return BEAGLE_SUCCESS;
}